

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap2d_qualities.cpp
# Opt level: O2

Reals __thiscall
Omega_h::swap2d_qualities_tmpl<2>(Omega_h *this,Mesh *mesh,AdaptOpts *opts,LOs *cands2edges)

{
  Real RVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  LO size_in;
  size_t sVar3;
  Int ent_dim;
  Reals RVar4;
  Reals cand_quals;
  Write<double> cand_quals_w;
  Write<int> local_1f8;
  Write<double> local_1e8;
  Write<double> local_1d8;
  Read<signed_char> edges_are_owned;
  LOs tri_verts2verts;
  LOs edge_verts2verts;
  Read<signed_char> et_codes;
  LOs et2t;
  LOs e2et;
  MetricEdgeLengths<2,_2> length_measure;
  MetricElementQualities<2,_2> quality_measure;
  type f;
  Adj e2t;
  
  Mesh::ask_up(&e2t,mesh,1,2);
  Write<int>::Write(&e2et.write_,(Write<int> *)&e2t);
  Write<int>::Write(&et2t.write_,&e2t.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&et_codes.write_,&e2t.codes.write_);
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&edge_verts2verts,ent_dim);
  Mesh::ask_verts_of((Mesh *)&tri_verts2verts,ent_dim);
  Mesh::owned((Mesh *)&edges_are_owned,ent_dim);
  MetricElementQualities<2,_2>::MetricElementQualities(&quality_measure,mesh);
  MetricEdgeLengths<2,_2>::MetricEdgeLengths(&length_measure,mesh);
  pAVar2 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar3 = pAVar2->size;
  }
  else {
    sVar3 = (ulong)pAVar2 >> 3;
  }
  RVar1 = opts->max_length_allowed;
  std::__cxx11::string::string((string *)&f,"",(allocator *)&cand_quals);
  size_in = (LO)(sVar3 >> 2);
  Write<double>::Write(&cand_quals_w,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&cands2edges->write_);
  Write<signed_char>::Write(&f.edges_are_owned.write_,&edges_are_owned.write_);
  Write<double>::Write(&f.cand_quals_w,&cand_quals_w);
  Write<int>::Write(&f.e2et.write_,&e2et.write_);
  Write<signed_char>::Write(&f.et_codes.write_,&et_codes.write_);
  Write<int>::Write(&f.et2t.write_,&et2t.write_);
  Write<int>::Write(&f.tri_verts2verts.write_,&tri_verts2verts.write_);
  MetricEdgeLengths<2,_2>::MetricEdgeLengths
            (&f.length_measure,(MetricEdgeLengths<3,_3> *)&length_measure);
  f.max_length = RVar1;
  Write<int>::Write(&f.edge_verts2verts.write_,&edge_verts2verts.write_);
  MetricElementQualities<2,_2>::MetricElementQualities
            (&f.quality_measure,(MetricElementQualities<3,_3> *)&quality_measure);
  parallel_for<Omega_h::swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&f,"swap2d_qualities");
  Write<double>::Write(&local_1d8,&cand_quals_w);
  Read<double>::Read((Read<signed_char> *)&cand_quals,&local_1d8);
  Write<double>::~Write(&local_1d8);
  Write<double>::Write(&local_1e8,&cand_quals.write_);
  Write<int>::Write(&local_1f8,&cands2edges->write_);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,(LOs *)&local_1e8,-1.0,(Int)&local_1f8);
  Write<int>::~Write(&local_1f8);
  Write<double>::~Write(&local_1e8);
  Write<double>::~Write(&cand_quals.write_);
  swap2d_qualities_tmpl<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h::Read<int>)::
  {lambda(int)#1}::~AdaptOpts((_lambda_int__1_ *)&f);
  Write<double>::~Write(&cand_quals_w);
  MetricEdgeLengths<2,_2>::~MetricEdgeLengths(&length_measure);
  MetricElementQualities<2,_2>::~MetricElementQualities(&quality_measure);
  Write<signed_char>::~Write(&edges_are_owned.write_);
  Write<int>::~Write(&tri_verts2verts.write_);
  Write<int>::~Write(&edge_verts2verts.write_);
  Write<signed_char>::~Write(&et_codes.write_);
  Write<int>::~Write(&et2t.write_);
  Write<int>::~Write(&e2et.write_);
  Adj::~Adj(&e2t);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals swap2d_qualities_tmpl(
    Mesh* mesh, AdaptOpts const& opts, LOs cands2edges) {
  auto e2t = mesh->ask_up(EDGE, FACE);
  auto e2et = e2t.a2ab;
  auto et2t = e2t.ab2b;
  auto et_codes = e2t.codes;
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto tri_verts2verts = mesh->ask_verts_of(FACE);
  auto edges_are_owned = mesh->owned(EDGE);
  auto quality_measure = MetricElementQualities<2, metric_dim>(mesh);
  auto length_measure = MetricEdgeLengths<2, metric_dim>(mesh);
  auto max_length = opts.max_length_allowed;
  auto ncands = cands2edges.size();
  auto cand_quals_w = Write<Real>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto edge = cands2edges[cand];
    /* non-owned edges will have incomplete cavities
       and will run into the topological assertions
       in find_loop(). don't bother; their results
       will be overwritten by the owner's anyways */
    if (!edges_are_owned[edge]) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    OMEGA_H_CHECK(e2et[edge + 1] == 2 + e2et[edge]);
    LO t[2];
    Few<LO, 2> ov;
    for (Int i = 0; i < 2; ++i) {
      auto et = e2et[edge] + i;
      auto code = et_codes[et];
      auto tte = code_which_down(code);
      auto rot = code_rotation(code);
      t[rot] = et2t[et];
      auto ttv = simplex_opposite_template(FACE, EDGE, tte);
      ov[rot] = tri_verts2verts[t[rot] * 3 + ttv];
    }
    auto l = length_measure.measure(ov);
    if (l > max_length) {
      cand_quals_w[cand] = -1.0;
      return;
    }
    auto ev = gather_verts<2>(edge_verts2verts, edge);
    Real minqual = 1.0;
    for (Int i = 0; i < 2; ++i) {
      Few<LO, 3> ntv;
      ntv[0] = ev[1 - i];
      ntv[1] = ov[i];
      ntv[2] = ov[1 - i];
      auto qual = quality_measure.measure(ntv);
      minqual = min2(minqual, qual);
    }
    cand_quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "swap2d_qualities");
  auto cand_quals = Reals(cand_quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, cands2edges, -1.0, 1);
}